

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

size_t __thiscall
proto2_unittest::TestNestedExtensionLite::ByteSizeLong(TestNestedExtensionLite *this)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = *(size_t *)((uVar1 & 0xfffffffffffffffe) + 0x10);
  }
  if ((SUB84(sVar2,0) != (anon_union_4_1_493b367e_for_TestNestedExtensionLite_5)0x0) ||
     (this->field_0 != (anon_union_4_1_493b367e_for_TestNestedExtensionLite_5)0x0)) {
    this->field_0 = SUB84(sVar2,0);
  }
  return sVar2;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }